

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O0

_Bool l_table_get_integer(lua_State *L,int tab,char *key,lua_Integer *result,
                         lua_Integer default_value)

{
  int iVar1;
  lua_Integer lVar2;
  _Bool rc;
  lua_Integer default_value_local;
  lua_Integer *result_local;
  char *key_local;
  int tab_local;
  lua_State *L_local;
  
  lua_pushstring(L,key);
  lua_gettable(L,tab);
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 != 0) {
    lVar2 = lua_tointegerx(L,-1,(int *)0x0);
    *result = lVar2;
  }
  else {
    *result = default_value;
  }
  lua_settop(L,-2);
  return iVar1 != 0;
}

Assistant:

static bool l_table_get_integer(lua_State *L, int tab, const char *key,
                                lua_Integer *result,
                                lua_Integer default_value) {
  bool rc = false;
  lua_pushstring(L, key);
  lua_gettable(L, tab); /* get table[key] */
  if (!lua_isnumber(L, -1))
    *result = default_value;
  else {
    *result = lua_tointeger(L, -1);
    rc = true;
  }
  lua_pop(L, 1); /* remove number */
  return rc;
}